

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O0

void __thiscall
symbol_table_visitor::visit(symbol_table_visitor *this,NotExtendedClassDeclaration *ptr)

{
  BaseScope *pBVar1;
  bool bVar2;
  ClassSymbol *pCVar3;
  mapped_type *ppBVar4;
  BaseScope *this_00;
  vector<Declaration_*,_std::allocator<Declaration_*>_> *this_01;
  reference ppDVar5;
  Declaration *i;
  iterator __end1;
  iterator __begin1;
  vector<Declaration_*,_std::allocator<Declaration_*>_> *__range1;
  BaseScope *old;
  NotExtendedClassDeclaration *ptr_local;
  symbol_table_visitor *this_local;
  
  assert_not_declared_in_this_scope(this,(ptr->super_Class_declaration).name);
  pBVar1 = this->curr_scope;
  pCVar3 = (ClassSymbol *)operator_new(0x58);
  ClassSymbol::ClassSymbol(pCVar3,&ptr->super_Class_declaration);
  this->curr_class = pCVar3;
  pCVar3 = this->curr_class;
  ppBVar4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>_>
            ::operator[](&pBVar1->symbols,(ptr->super_Class_declaration).name);
  *ppBVar4 = &pCVar3->super_BaseSymbol;
  this_00 = (BaseScope *)operator_new(0xa0);
  memset(this_00,0,0xa0);
  BaseScope::BaseScope(this_00);
  this->curr_scope = this_00;
  Class_declaration::SetScope(&ptr->super_Class_declaration,this->curr_scope);
  this->curr_scope->parent = pBVar1;
  std::vector<BaseScope_*,_std::allocator<BaseScope_*>_>::push_back
            (&pBVar1->children,&this->curr_scope);
  this_01 = &(ptr->super_Class_declaration).decls;
  __end1 = std::vector<Declaration_*,_std::allocator<Declaration_*>_>::begin(this_01);
  i = (Declaration *)std::vector<Declaration_*,_std::allocator<Declaration_*>_>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>
                                *)&i);
    if (!bVar2) break;
    ppDVar5 = __gnu_cxx::
              __normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>
              ::operator*(&__end1);
    (**((*ppDVar5)->super_Base)._vptr_Base)(*ppDVar5,this);
    __gnu_cxx::
    __normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>::
    operator++(&__end1);
  }
  this->curr_scope = pBVar1;
  this->curr_class = (ClassSymbol *)0x0;
  return;
}

Assistant:

void symbol_table_visitor::visit(NotExtendedClassDeclaration* ptr) {
    assert_not_declared_in_this_scope(ptr->name);
    
    auto old = curr_scope;

    curr_class = new ClassSymbol(ptr);
    old->symbols[*ptr->name] = curr_class;
    curr_scope = new BaseScope();
    ptr->SetScope(curr_scope);
    curr_scope->parent = old;
    old->children.push_back(curr_scope);

    for(auto i : ptr->decls) {
        i->accept(this);
    }

    curr_scope = old;
    curr_class = nullptr;
    //name
}